

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_menu_begin_image_text
                  (nk_context *ctx,char *title,int len,nk_flags align,nk_image img,nk_vec2 size)

{
  nk_vec2 size_00;
  nk_rect header_00;
  nk_rect bounds;
  nk_image img_00;
  nk_widget_layout_states nVar1;
  nk_bool nVar2;
  undefined4 in_EDX;
  undefined8 unaff_RBX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 unaff_R14;
  undefined8 unaff_retaddr;
  nk_style_button *in_stack_00000008;
  nk_user_font *in_stack_00000010;
  nk_input *in_stack_00000018;
  nk_flags state;
  int is_clicked;
  nk_input *in;
  nk_rect header;
  nk_window *win;
  int in_stack_ffffffffffffff8c;
  nk_context *in_stack_ffffffffffffff90;
  char *id;
  nk_window *win_00;
  nk_button_behavior behavior;
  float len_00;
  float in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  nk_command_buffer *in_stack_ffffffffffffffb8;
  float fVar3;
  undefined4 uVar4;
  float fVar5;
  undefined4 uStack_24;
  int local_14;
  
  win_00 = (nk_window *)&stack0x00000008;
  fVar5 = (float)in_RDI;
  uStack_24 = (undefined4)((ulong)in_RDI >> 0x20);
  behavior = NK_BUTTON_DEFAULT;
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x40d8) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) == 0)) {
    local_14 = 0;
  }
  else {
    fVar3 = (float)*(undefined8 *)(in_RDI + 0x40d8);
    uVar4 = (undefined4)((ulong)*(undefined8 *)(in_RDI + 0x40d8) >> 0x20);
    nVar1 = nk_widget((nk_rect *)win_00,in_stack_ffffffffffffff90);
    if (nVar1 == NK_WIDGET_INVALID) {
      local_14 = 0;
    }
    else {
      if ((nVar1 == NK_WIDGET_ROM) ||
         ((*(uint *)(*(long *)(CONCAT44(uVar4,fVar3) + 0xa8) + 4) & 0x1000) != 0)) {
        id = (char *)0x0;
      }
      else {
        id = (char *)CONCAT44(uStack_24,fVar5);
      }
      len_00 = (float)((ulong)id >> 0x20);
      bounds.y = (float)(int)in_RSI;
      bounds.w = (float)(int)((ulong)in_RSI >> 0x20);
      bounds.x = (float)in_EDX;
      bounds.h = fVar5;
      img_00.w = (short)unaff_R14;
      img_00.h = (short)((ulong)unaff_R14 >> 0x10);
      img_00.region[0] = (short)((ulong)unaff_R14 >> 0x20);
      img_00.region[1] = (short)((ulong)unaff_R14 >> 0x30);
      img_00.handle = (nk_handle)unaff_RBX;
      img_00._16_8_ = unaff_retaddr;
      nVar2 = nk_do_button_text_image
                        ((nk_flags *)CONCAT44(uVar4,fVar3),in_stack_ffffffffffffffb8,bounds,img_00,
                         (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (int)len_00,(nk_flags)id,behavior,in_stack_00000008,in_stack_00000010,
                         in_stack_00000018);
      if (nVar2 != 0) {
        behavior = NK_BUTTON_REPEATER;
      }
      header_00._4_8_ = in_stack_ffffffffffffffb8;
      header_00.x = (float)in_stack_ffffffffffffffb4;
      header_00.h = fVar3;
      size_00.y = in_stack_ffffffffffffffb0;
      size_00.x = len_00;
      local_14 = nk_menu_begin((nk_context *)CONCAT44(behavior,nVar1),win_00,id,
                               in_stack_ffffffffffffff8c,header_00,size_00);
    }
  }
  return local_14;
}

Assistant:

NK_API nk_bool
nk_menu_begin_image_text(struct nk_context *ctx, const char *title, int len,
nk_flags align, struct nk_image img, struct nk_vec2 size)
{
struct nk_window *win;
struct nk_rect header;
const struct nk_input *in;
int is_clicked = nk_false;
nk_flags state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
state = nk_widget(&header, ctx);
if (!state) return 0;
in = (state == NK_WIDGET_ROM || win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
if (nk_do_button_text_image(&ctx->last_widget_state, &win->buffer,
header, img, title, len, align, NK_BUTTON_DEFAULT, &ctx->style.menu_button,
ctx->style.font, in))
is_clicked = nk_true;
return nk_menu_begin(ctx, win, title, is_clicked, header, size);
}